

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O1

void __thiscall
CServerBrowser::Set(CServerBrowser *this,NETADDR *Addr,int SetType,int Token,CServerInfo *pInfo)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  CServerEntry *pCVar4;
  CServerEntry *pEntry;
  int64 iVar5;
  int64 iVar6;
  int iVar7;
  CServerEntry **ppCVar8;
  int64 *piVar9;
  
  if (SetType != 3) {
    if (SetType == 2) {
      if ((this->m_RefreshFlags & 1) == 0) {
        return;
      }
    }
    else {
      if (SetType != 1) {
        pEntry = (CServerEntry *)0x0;
        goto LAB_0012b8d5;
      }
      if ((this->m_RefreshFlags & 1) == 0) {
        return;
      }
      this->m_MasterRefreshTime = 0;
    }
    pEntry = (CServerEntry *)0x0;
    pCVar4 = Find(this,0,Addr);
    if (pCVar4 == (CServerEntry *)0x0) {
      pEntry = Add(this,0,Addr);
      pCVar4 = this->m_pLastReqServer;
      pEntry->m_pPrevReq = pCVar4;
      ppCVar8 = &pCVar4->m_pNextReq;
      if (pCVar4 == (CServerEntry *)0x0) {
        ppCVar8 = &this->m_pFirstReqServer;
      }
      *ppCVar8 = pEntry;
      this->m_pLastReqServer = pEntry;
      this->m_NumRequests = this->m_NumRequests + 1;
    }
    goto LAB_0012b8d5;
  }
  iVar7 = 0;
  if (((((this->m_RefreshFlags & 1) == 0) ||
       (pEntry = Find(this,0,Addr), pEntry == (CServerEntry *)0x0)) || (pEntry->m_InfoState != 1))
     || (pEntry->m_CurrentToken != Token)) {
    pEntry = (CServerEntry *)0x0;
  }
  bVar2 = false;
  if (pEntry == (CServerEntry *)0x0) {
    if ((this->m_RefreshFlags & 2) != 0) {
      lVar1 = this->m_BroadcastTime;
      iVar5 = time_freq();
      iVar6 = time_get();
      if (iVar6 <= iVar5 + lVar1) {
        iVar7 = 1;
        pEntry = Add(this,1,Addr);
        bVar2 = true;
        goto LAB_0012b86e;
      }
    }
    pEntry = (CServerEntry *)0x0;
    bVar2 = false;
    iVar7 = 0;
  }
LAB_0012b86e:
  if (pEntry != (CServerEntry *)0x0) {
    SetInfo(this,iVar7,pEntry,pInfo);
    iVar5 = time_get();
    piVar9 = &pEntry->m_RequestTime;
    if (bVar2) {
      piVar9 = &this->m_BroadcastTime;
    }
    lVar1 = *piVar9;
    iVar6 = time_freq();
    iVar3 = (int)(((iVar5 - lVar1) * 1000) / iVar6);
    iVar7 = 999;
    if (iVar3 < 999) {
      iVar7 = iVar3;
    }
    (pEntry->m_Info).m_Latency = iVar7;
    this->m_InfoUpdated = true;
    RemoveRequest(this,pEntry);
  }
LAB_0012b8d5:
  if (pEntry == (CServerEntry *)0x0) {
    return;
  }
  CServerBrowserFilter::Sort
            (&this->m_ServerBrowserFilter,
             this->m_aServerlist[this->m_ActServerlistType].m_ppServerlist,
             this->m_aServerlist[this->m_ActServerlistType].m_NumServers,1);
  return;
}

Assistant:

void CServerBrowser::Set(const NETADDR &Addr, int SetType, int Token, const CServerInfo *pInfo)
{
	CServerEntry *pEntry = 0;
	switch(SetType)
	{
	case SET_MASTER_ADD:
		{
			if(!(m_RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET))
				return;

			m_MasterRefreshTime = 0;

			if(!Find(IServerBrowser::TYPE_INTERNET, Addr))
			{
				pEntry = Add(IServerBrowser::TYPE_INTERNET, Addr);
				QueueRequest(pEntry);
			}
		}
		break;
	case SET_FAV_ADD:
		{
			if(!(m_RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET))
				return;

			if(!Find(IServerBrowser::TYPE_INTERNET, Addr))
			{
				pEntry = Add(IServerBrowser::TYPE_INTERNET, Addr);
				QueueRequest(pEntry);
			}
		}
		break;
	case SET_TOKEN:
		{
			int Type;

			// internet entry
			if(m_RefreshFlags&IServerBrowser::REFRESHFLAG_INTERNET)
			{
				Type = IServerBrowser::TYPE_INTERNET;
				pEntry = Find(Type, Addr);
				if(pEntry && (pEntry->m_InfoState != CServerEntry::STATE_PENDING || Token != pEntry->m_CurrentToken))
					pEntry = 0;
			}

			// lan entry
			if(!pEntry && (m_RefreshFlags&IServerBrowser::REFRESHFLAG_LAN) && m_BroadcastTime+time_freq() >= time_get())
			{
				Type = IServerBrowser::TYPE_LAN;
				pEntry = Add(Type, Addr);
			}

			// set info
			if(pEntry)
			{
				SetInfo(Type, pEntry, *pInfo);
				if(Type == IServerBrowser::TYPE_LAN)
					pEntry->m_Info.m_Latency = minimum(static_cast<int>((time_get()-m_BroadcastTime)*1000/time_freq()), 999);
				else
					pEntry->m_Info.m_Latency = minimum(static_cast<int>((time_get()-pEntry->m_RequestTime)*1000/time_freq()), 999);
				m_InfoUpdated = true;
				RemoveRequest(pEntry);
			}
		}
	}

	if(pEntry)
		m_ServerBrowserFilter.Sort(m_aServerlist[m_ActServerlistType].m_ppServerlist, m_aServerlist[m_ActServerlistType].m_NumServers, CServerBrowserFilter::RESORT_FLAG_FORCE);
}